

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluHashTableCheck(If_Man_t *p)

{
  word *t;
  byte bVar1;
  int iVar2;
  uint uVar3;
  undefined8 *puVar4;
  long lVar5;
  
  if (0 < p->nTableSize[1]) {
    lVar5 = 0;
    do {
      for (puVar4 = (undefined8 *)p->pHashTable[1][lVar5]; puVar4 != (undefined8 *)0x0;
          puVar4 = (undefined8 *)*puVar4) {
        bVar1 = *(byte *)(puVar4 + 1);
        t = puVar4 + 2;
        iVar2 = If_CluSupportSize(t,0xd);
        uVar3 = If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
        if (uVar3 != ((bVar1 & 0xf) != 0)) {
          Kit_DsdPrintFromTruth((uint *)t,0xd);
          putchar(10);
          iVar2 = If_CluSupportSize(t,0xd);
          If_CutPerformCheck16((If_Man_t *)0x0,(uint *)t,0xd,iVar2,"555");
          puts("Hash table problem!!!");
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nTableSize[1]);
  }
  return;
}

Assistant:

void If_CluHashTableCheck( If_Man_t * p )
{
    int t = 1;
    If_Hte_t * pEntry;
    int i, RetValue, Status;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {        
            Status = ((pEntry->Group & 15) > 0);
            RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
            if ( RetValue != Status ) 
            {
                Kit_DsdPrintFromTruth( (unsigned*)pEntry->pTruth, 13 ); printf( "\n" );
                RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
                printf( "Hash table problem!!!\n" );
            }
        }
    }
}